

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

void sexp_define_accessors
               (sexp_conflict ctx,sexp_conflict env,sexp_uint_t ctype,sexp_uint_t cindex,char *get,
               char *set)

{
  undefined8 uVar1;
  long lVar2;
  long in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict op;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict name;
  sexp_conflict index;
  sexp_conflict type;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  ulong local_40;
  ulong local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  undefined8 local_10;
  long local_8;
  
  local_48 = 0x43e;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_58,0,0x10);
  local_60 = 0x43e;
  memset(&local_70,0,0x10);
  lVar2 = local_8;
  local_58 = &local_48;
  local_50 = *(undefined8 *)(local_8 + 0x6080);
  *(undefined8 ***)(local_8 + 0x6080) = &local_58;
  local_70 = &local_60;
  local_68 = *(undefined8 *)(local_8 + 0x6080);
  *(undefined8 ***)(local_8 + 0x6080) = &local_70;
  local_38 = local_18 << 1 | 1;
  local_40 = local_20 << 1 | 1;
  if (local_28 != 0) {
    local_48 = sexp_c_string(local_8,local_28,0xffffffffffffffff);
    local_60 = sexp_make_getter_op(lVar2,0,3,local_48,local_38,local_40);
    lVar2 = local_8;
    uVar1 = local_10;
    local_48 = sexp_intern(local_8,local_28,0xffffffffffffffff);
    sexp_env_define(lVar2,uVar1,local_48,local_60);
  }
  lVar2 = local_8;
  if (local_30 != 0) {
    local_48 = sexp_c_string(local_8,local_30,0xffffffffffffffff);
    local_60 = sexp_make_setter_op(lVar2,0,3,local_48,local_38,local_40);
    lVar2 = local_8;
    local_48 = sexp_intern(local_8,local_30,0xffffffffffffffff);
    sexp_env_define(lVar2,local_10,local_48,local_60);
  }
  *(undefined8 *)(local_8 + 0x6080) = local_50;
  return;
}

Assistant:

static void sexp_define_accessors (sexp ctx, sexp env, sexp_uint_t ctype,
                                   sexp_uint_t cindex,
                                   const char* get, const char *set) {
  sexp type, index;
  sexp_gc_var2(name, op);
  sexp_gc_preserve2(ctx, name, op);
  type = sexp_make_fixnum(ctype);
  index = sexp_make_fixnum(cindex);
  if (get) {
    op = sexp_make_getter(ctx, name=sexp_c_string(ctx, get, -1), type, index);
    sexp_env_define(ctx, env, name=sexp_intern(ctx, get, -1), op);
  }
  if (set) {
    op = sexp_make_setter(ctx, name=sexp_c_string(ctx, set, -1), type, index);
    sexp_env_define(ctx, env, name=sexp_intern(ctx, set, -1), op);
  }
  sexp_gc_release2(ctx);
}